

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact,bool realname)

{
  bool bVar1;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  char local_a1;
  string local_a0;
  string local_80;
  char local_49;
  string local_48;
  undefined1 local_26;
  byte local_25;
  ArtifactType local_24;
  bool realname_local;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_26 = 0;
  local_25 = realname;
  local_24 = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetDirectory(&local_48,this,config,artifact);
  local_49 = '/';
  cmStrCat<std::__cxx11::string,char>(__return_storage_ptr__,&local_48,&local_49);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    BuildBundleDirectory(&local_a0,this,__return_storage_ptr__,psStack_20,FullLevel);
    local_a1 = '/';
    cmStrCat<std::__cxx11::string,char>(&local_80,&local_a0,&local_a1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if (local_24 == RuntimeBinaryArtifact) {
    if ((local_25 & 1) == 0) {
      GetFullName(&local_e8,this,psStack_20,RuntimeBinaryArtifact);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      NormalGetRealName(&local_c8,this,psStack_20,RuntimeBinaryArtifact);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
  }
  else if (local_24 == ImportLibraryArtifact) {
    if ((local_25 & 1) == 0) {
      GetFullName(&local_128,this,psStack_20,ImportLibraryArtifact);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      NormalGetRealName(&local_108,this,psStack_20,ImportLibraryArtifact);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  bool realname) const
{
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  if (this->IsAppBundleOnApple()) {
    fpath =
      cmStrCat(this->BuildBundleDirectory(fpath, config, FullLevel), '/');
  }

  // Add the full name of the target.
  switch (artifact) {
    case cmStateEnums::RuntimeBinaryArtifact:
      if (realname) {
        fpath += this->NormalGetRealName(config);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
      }
      break;
    case cmStateEnums::ImportLibraryArtifact:
      if (realname) {
        fpath +=
          this->NormalGetRealName(config, cmStateEnums::ImportLibraryArtifact);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::ImportLibraryArtifact);
      }
      break;
  }
  return fpath;
}